

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::MILSpec::TensorValue::set_allocated_bytes
          (TensorValue *this,TensorValue_RepeatedBytes *bytes)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_value(this);
  if (bytes != (TensorValue_RepeatedBytes *)0x0) {
    uVar1 = (bytes->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar1 & 2) == 0) {
      submessage_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        submessage_arena = *(Arena **)submessage_arena;
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      bytes = (TensorValue_RepeatedBytes *)
              google::protobuf::internal::GetOwnedMessageInternal
                        (message_arena,&bytes->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 7;
    (this->value_).bytes_ = bytes;
  }
  return;
}

Assistant:

void TensorValue::set_allocated_bytes(::CoreML::Specification::MILSpec::TensorValue_RepeatedBytes* bytes) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_value();
  if (bytes) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::MILSpec::TensorValue_RepeatedBytes>::GetOwningArena(bytes);
    if (message_arena != submessage_arena) {
      bytes = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, bytes, submessage_arena);
    }
    set_has_bytes();
    value_.bytes_ = bytes;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.MILSpec.TensorValue.bytes)
}